

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ImportBaseFuncWrapper::getLibName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  char *pcVar3;
  char *ch;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x23])(this);
  ch = "";
  if (CONCAT44(extraout_var,iVar1) != 0) {
    plVar2 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar1),&PENodeWrapper::typeinfo,
                                    &ImportBaseEntryWrapper::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      pcVar3 = (char *)(**(code **)(*plVar2 + 0x188))(plVar2);
      ch = "";
      if (pcVar3 != (char *)0x0) {
        ch = pcVar3;
      }
    }
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getLibName()
{
    ImportBaseEntryWrapper *p = dynamic_cast<ImportBaseEntryWrapper*>(this->getParentNode());
    if (!p) return "";
    
    char *libName = p->getLibraryName();
    if (!libName) return "";
    
    return QString(libName);
}